

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O2

bool pstore::command_line::details::check_for_missing<std::ostream>
               (string *program_name,basic_ostream<char,_std::char_traits<char>_> *errs)

{
  option *this;
  uint uVar1;
  int iVar2;
  _List_node_base *p_Var3;
  ostream *poVar4;
  string *psVar5;
  bool bVar6;
  char *pcVar7;
  int iVar8;
  _List_node_base *p_Var9;
  
  bVar6 = true;
  iVar8 = 0;
  p_Var3 = (_List_node_base *)option::all_abi_cxx11_();
  p_Var9 = p_Var3;
  while (p_Var9 = (((_List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
                     *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var9 != p_Var3) {
    this = (option *)p_Var9[1]._M_next;
    uVar1 = (*this->_vptr_option[3])(this);
    if ((uVar1 & 0xfffffffe) == 2) {
      iVar2 = (*this->_vptr_option[4])(this);
      if (iVar2 == 0) {
        iVar2 = (*this->_vptr_option[9])(this);
        if ((char)iVar2 == '\0') {
          poVar4 = std::operator<<(errs,(string *)program_name);
          poVar4 = std::operator<<(poVar4,": option \'");
          psVar5 = option::name_abi_cxx11_(this);
          poVar4 = std::operator<<(poVar4,(string *)psVar5);
          std::operator<<(poVar4,"\' must be specified at least once\n");
          bVar6 = false;
        }
        else {
          iVar8 = iVar8 + 1;
          bVar6 = false;
        }
      }
    }
  }
  if (iVar8 != 0) {
    if (iVar8 == 1) {
      poVar4 = std::operator<<(errs,(string *)program_name);
      pcVar7 = ": a positional argument was missing\n";
    }
    else {
      poVar4 = std::operator<<(errs,(string *)program_name);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      pcVar7 = ": positional arguments are missing\n";
    }
    std::operator<<(poVar4,pcVar7);
  }
  return bVar6;
}

Assistant:

bool check_for_missing (std::string const & program_name, ErrorStream & errs) {
                using str = stream_trait<typename ErrorStream::char_type>;
                using pstore::command_line::num_occurrences_flag;
                using pstore::command_line::option;

                bool ok = true;
                auto positional_missing = 0U;

                for (option const * const opt : option::all ()) {
                    switch (opt->get_num_occurrences_flag ()) {
                    case num_occurrences_flag::required:
                    case num_occurrences_flag::one_or_more:
                        if (opt->get_num_occurrences () == 0U) {
                            if (opt->is_positional ()) {
                                ++positional_missing;
                            } else {
                                errs << str::out_string (program_name)
                                     << str::out_text (": option '")
                                     << str::out_string (opt->name ())
                                     << str::out_text ("' must be specified at least once\n");
                            }
                            ok = false;
                        }
                        break;
                    case num_occurrences_flag::optional:
                    case num_occurrences_flag::zero_or_more: break;
                    }
                }

                if (positional_missing == 1U) {
                    errs << str::out_string (program_name)
                         << str::out_text (": a positional argument was missing\n");
                } else if (positional_missing > 1U) {
                    errs << str::out_string (program_name) << positional_missing
                         << str::out_text (": positional arguments are missing\n");
                }

                return ok;
            }